

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake.c
# Opt level: O3

decaf_error_t
decaf_sha3_hash(uint8_t *out,size_t outlen,uint8_t *in,size_t inlen,decaf_kparams_s *params)

{
  decaf_error_t dVar1;
  decaf_keccak_sponge_t decaf_sponge;
  decaf_keccak_sponge_s dStack_108;
  
  memset(&dStack_108,0,200);
  dStack_108.params[0] = *params & 0xffffffffffffff00;
  decaf_sha3_update(&dStack_108,in,inlen);
  dVar1 = decaf_sha3_output(&dStack_108,out,outlen);
  decaf_bzero(&dStack_108,0xd0);
  return dVar1;
}

Assistant:

decaf_error_t decaf_sha3_hash (
    uint8_t *out,
    size_t outlen,
    const uint8_t *in,
    size_t inlen,
    const struct decaf_kparams_s *params
) {
    decaf_keccak_sponge_t decaf_sponge;
    decaf_sha3_init(decaf_sponge, params);
    decaf_sha3_update(decaf_sponge, in, inlen);
    decaf_error_t ret = decaf_sha3_output(decaf_sponge, out, outlen);
    decaf_sha3_destroy(decaf_sponge);
    return ret;
}